

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references.cpp
# Opt level: O1

void CreateBackwardReferencesNH4
               (size_t num_bytes,size_t position,uint8_t *ringbuffer,size_t ringbuffer_mask,
               ContextLut literal_context_lut,BrotliEncoderParams *params,Hasher *hasher,
               int *dist_cache,size_t *last_insert_len,Command *commands,size_t *num_commands,
               size_t *num_literals)

{
  long lVar1;
  BrotliDictionary *pBVar2;
  uint8_t *puVar3;
  uint8_t *puVar4;
  size_t sVar5;
  size_t sVar6;
  uint32_t *puVar7;
  BrotliEncoderDictionary *pBVar8;
  BrotliDictionary *pBVar9;
  HasherCommon *pHVar10;
  ulong uVar11;
  bool bVar12;
  ulong uVar13;
  int iVar14;
  uint uVar15;
  ushort uVar16;
  uint32_t uVar17;
  int iVar18;
  BrotliDictionary *pBVar19;
  BrotliDictionary *pBVar20;
  BrotliDictionary *pBVar21;
  uint8_t *puVar22;
  BrotliDictionary *pBVar23;
  byte bVar24;
  ulong uVar25;
  ulong uVar26;
  long lVar27;
  BrotliDictionary *pBVar28;
  uint16_t uVar29;
  BrotliDictionary *pBVar30;
  BrotliDictionary *pBVar31;
  uint uVar32;
  ulong *puVar33;
  BrotliDictionary *pBVar34;
  int iVar35;
  BrotliDictionary *pBVar36;
  BrotliDictionary *pBVar37;
  uint8_t uVar38;
  uint uVar39;
  ulong *puVar40;
  int iVar41;
  BrotliDictionary *unaff_R12;
  BrotliDictionary *pBVar42;
  BrotliDictionary *unaff_R14;
  ulong *puVar43;
  BrotliDictionary *pBVar44;
  BrotliDictionary *pBVar45;
  BrotliDictionary *pBVar46;
  bool bVar47;
  long lVar48;
  long lVar49;
  ulong local_170;
  size_t local_160;
  int local_154;
  BrotliDictionary *local_150;
  BrotliDictionary *local_130;
  ulong local_128;
  BrotliDictionary *local_120;
  Command *local_108;
  uint local_f4;
  ulong local_98;
  ulong auStack_58 [5];
  
  local_160 = *last_insert_len;
  puVar4 = (uint8_t *)(position + num_bytes);
  pBVar19 = (BrotliDictionary *)((position - 7) + num_bytes);
  if (num_bytes < 8) {
    pBVar19 = (BrotliDictionary *)position;
  }
  pBVar36 = (BrotliDictionary *)0x200;
  if (params->quality < 9) {
    pBVar36 = (BrotliDictionary *)0x40;
  }
  if ((uint8_t *)(position + 8) < puVar4) {
    pBVar30 = (BrotliDictionary *)((1L << ((byte)params->lgwin & 0x3f)) + -0x10);
    sVar5 = params->stream_offset;
    sVar6 = (params->dictionary).compound.total_size;
    pBVar46 = (BrotliDictionary *)(pBVar36->size_bits_by_length + position);
    puVar7 = (hasher->privat)._H2.buckets_;
    uVar15 = (uint)ringbuffer_mask;
    lVar1 = sVar6 + 1;
    pBVar2 = (BrotliDictionary *)(puVar4 + 0xfffffffffffffff9);
    local_108 = commands;
    pBVar23 = (BrotliDictionary *)position;
    do {
      pBVar20 = pBVar30;
      if (pBVar23 < pBVar30) {
        pBVar20 = pBVar23;
      }
      pBVar31 = (BrotliDictionary *)(pBVar23->size_bits_by_length + sVar5);
      if (pBVar30 <= (BrotliDictionary *)(pBVar23->size_bits_by_length + sVar5)) {
        pBVar31 = pBVar30;
      }
      if ((params->dictionary).contextual.context_based == 0) {
        local_f4 = 0;
        local_98 = 0;
      }
      else {
        if (pBVar23 == (BrotliDictionary *)0x0) {
          local_98 = 0;
        }
        else {
          local_98 = (ulong)ringbuffer[(ulong)((long)&pBVar23[-1].data + 7U) & ringbuffer_mask];
        }
        if (pBVar23 < (BrotliDictionary *)0x2) {
          uVar25 = 0;
        }
        else {
          uVar25 = (ulong)ringbuffer[(ulong)((long)&pBVar23[-1].data + 6U) & ringbuffer_mask];
        }
        local_f4 = (uint)(params->dictionary).contextual.context_map
                         [literal_context_lut[uVar25 + 0x100] | literal_context_lut[local_98]];
      }
      local_150 = (BrotliDictionary *)(puVar4 + -(long)pBVar23);
      pBVar8 = (params->dictionary).contextual.dict[local_f4];
      pBVar9 = (BrotliDictionary *)(params->dist).max_distance;
      uVar25 = (ulong)pBVar23 & ringbuffer_mask;
      pBVar28 = (BrotliDictionary *)(ringbuffer + uVar25);
      uVar38 = ringbuffer[uVar25];
      local_130 = (BrotliDictionary *)(long)*dist_cache;
      local_128 = 0x7e4;
      pBVar45 = local_130;
      if (((BrotliDictionary *)((long)pBVar23 - (long)local_130) < pBVar23) &&
         (uVar32 = (uint)(BrotliDictionary *)((long)pBVar23 - (long)local_130) & uVar15,
         uVar38 == ringbuffer[uVar32])) {
        puVar33 = (ulong *)(ringbuffer + uVar32);
        pBVar44 = local_150;
        pBVar45 = pBVar28;
        puVar43 = puVar33;
        for (pBVar21 = local_150; (BrotliDictionary *)0x7 < pBVar21;
            pBVar21 = (BrotliDictionary *)&pBVar21[-1].data) {
          pBVar37 = *(BrotliDictionary **)pBVar45->size_bits_by_length;
          unaff_R12 = (BrotliDictionary *)*puVar43;
          if (pBVar37 == unaff_R12) {
            puVar43 = puVar43 + 1;
          }
          else {
            uVar26 = 0;
            if (((ulong)unaff_R12 ^ (ulong)pBVar37) != 0) {
              for (; (((ulong)unaff_R12 ^ (ulong)pBVar37) >> uVar26 & 1) == 0; uVar26 = uVar26 + 1)
              {
              }
            }
            pBVar44 = (BrotliDictionary *)
                      ((long)puVar43 + ((uVar26 >> 3 & 0x1fffffff) - (long)puVar33));
          }
          if (pBVar37 != unaff_R12) goto LAB_0112bc6d;
          pBVar45 = (BrotliDictionary *)(pBVar45->size_bits_by_length + 8);
        }
        if (pBVar21 != (BrotliDictionary *)0x0) {
          pBVar44 = (BrotliDictionary *)0x0;
          do {
            pBVar37 = pBVar44;
            if (*(uint8_t *)((long)puVar43 + (long)pBVar44) !=
                pBVar44->size_bits_by_length[(long)pBVar45->size_bits_by_length]) break;
            pBVar44 = (BrotliDictionary *)(pBVar44->size_bits_by_length + 1);
            pBVar37 = pBVar21;
          } while (pBVar21 != pBVar44);
          puVar43 = (ulong *)((long)puVar43 + (long)pBVar37);
        }
        pBVar44 = (BrotliDictionary *)((long)puVar43 - (long)puVar33);
LAB_0112bc6d:
        unaff_R14 = pBVar44;
        if ((pBVar44 < (BrotliDictionary *)0x4) ||
           (uVar26 = (long)pBVar44 * 0x87 + 0x78f, uVar26 < 0x7e5)) goto LAB_0112bc98;
        uVar38 = pBVar44->size_bits_by_length[(long)pBVar28->size_bits_by_length];
        local_128 = uVar26;
      }
      else {
LAB_0112bc98:
        local_130 = (BrotliDictionary *)0x0;
        pBVar44 = (BrotliDictionary *)0x0;
      }
      uVar32 = (uint)((ulong)(*(long *)(ringbuffer + uVar25) * 0x7bd3579bd3000000) >> 0x2f);
      lVar27 = 0;
      lVar48 = 0;
      lVar49 = 1;
      do {
        auStack_58[lVar27] = lVar48 * 8 + (ulong)uVar32 & 0x1ffff;
        auStack_58[lVar27 + 1] = lVar49 * 8 + (ulong)uVar32 & 0x1ffff;
        lVar27 = lVar27 + 2;
        lVar48 = lVar48 + 2;
        lVar49 = lVar49 + 2;
      } while (lVar27 != 4);
      lVar48 = *(long *)((long)auStack_58 + (ulong)((uint)pBVar23 & 0x18));
      lVar49 = 0;
      do {
        uVar32 = puVar7[auStack_58[lVar49]];
        puVar43 = (ulong *)(ringbuffer + (uVar15 & uVar32));
        if (((uVar38 == pBVar44->size_bits_by_length[(long)puVar43]) &&
            (pBVar23 != (BrotliDictionary *)(ulong)uVar32)) &&
           (unaff_R14 = (BrotliDictionary *)((long)pBVar23 - (long)(ulong)uVar32),
           pBVar21 = local_150, pBVar37 = pBVar28, puVar33 = puVar43, unaff_R14 <= pBVar20)) {
          for (; (BrotliDictionary *)0x7 < pBVar21; pBVar21 = (BrotliDictionary *)&pBVar21[-1].data)
          {
            uVar25 = *(ulong *)pBVar37->size_bits_by_length;
            uVar26 = *puVar33;
            if (uVar25 == uVar26) {
              puVar33 = puVar33 + 1;
            }
            else {
              uVar11 = 0;
              if ((uVar26 ^ uVar25) != 0) {
                for (; ((uVar26 ^ uVar25) >> uVar11 & 1) == 0; uVar11 = uVar11 + 1) {
                }
              }
              unaff_R12 = (BrotliDictionary *)((long)puVar33 - (long)puVar43);
              pBVar45 = (BrotliDictionary *)
                        (unaff_R12->size_bits_by_length + (uVar11 >> 3 & 0x1fffffff));
            }
            if (uVar25 != uVar26) goto LAB_0112bddd;
            pBVar37 = (BrotliDictionary *)(pBVar37->size_bits_by_length + 8);
          }
          puVar40 = puVar33;
          if (pBVar21 != (BrotliDictionary *)0x0) {
            puVar40 = (ulong *)((long)puVar33 + (long)pBVar21);
            pBVar45 = (BrotliDictionary *)0x0;
            do {
              unaff_R12 = (BrotliDictionary *)
                          CONCAT71((int7)((ulong)unaff_R12 >> 8),
                                   *(uint8_t *)((long)puVar33 + (long)pBVar45));
              if (*(uint8_t *)((long)puVar33 + (long)pBVar45) !=
                  pBVar45->size_bits_by_length[(long)pBVar37->size_bits_by_length]) {
                puVar40 = (ulong *)((long)puVar33 + (long)pBVar45);
                break;
              }
              pBVar45 = (BrotliDictionary *)(pBVar45->size_bits_by_length + 1);
            } while (pBVar21 != pBVar45);
          }
          pBVar45 = (BrotliDictionary *)((long)puVar40 - (long)puVar43);
LAB_0112bddd:
          if ((BrotliDictionary *)0x3 < pBVar45) {
            iVar18 = 0x1f;
            if ((uint)unaff_R14 != 0) {
              for (; (uint)unaff_R14 >> iVar18 == 0; iVar18 = iVar18 + -1) {
              }
            }
            uVar25 = (ulong)(iVar18 * -0x1e + 0x780) + (long)pBVar45 * 0x87;
            if (local_128 < uVar25) {
              uVar38 = pBVar45->size_bits_by_length[(long)pBVar28->size_bits_by_length];
              pBVar44 = pBVar45;
              local_130 = unaff_R14;
              local_128 = uVar25;
            }
          }
        }
        lVar49 = lVar49 + 1;
      } while (lVar49 != 4);
      local_154 = 0;
      if ((local_128 == 0x7e4) &&
         (pHVar10 = (hasher->privat)._H2.common,
         pHVar10->dict_num_lookups >> 7 <= pHVar10->dict_num_matches)) {
        iVar18 = *(int *)pBVar28->size_bits_by_length;
        puVar22 = pBVar8->hash_table_lengths;
        pHVar10->dict_num_lookups = pHVar10->dict_num_lookups + 1;
        uVar25 = (ulong)((uint)(iVar18 * 0x1e35a7bd) >> 0x12);
        bVar24 = puVar22[uVar25 * 2];
        pBVar20 = (BrotliDictionary *)(ulong)bVar24;
        if (pBVar20 != (BrotliDictionary *)0x0) {
          bVar47 = true;
          local_154 = 0;
          if (pBVar20 <= local_150) {
            unaff_R14 = (BrotliDictionary *)(ulong)pBVar8->hash_table_words[uVar25 * 2];
            pBVar45 = pBVar8->words;
            puVar43 = (ulong *)(pBVar45->data +
                               (ulong)pBVar45->offsets_by_length[(long)pBVar20] +
                               (long)unaff_R14 * (long)pBVar20);
            pBVar21 = pBVar28;
            pBVar37 = pBVar20;
            if (7 < bVar24) {
              do {
                uVar25 = *puVar43;
                uVar26 = *(ulong *)pBVar21->size_bits_by_length;
                if (uVar25 == uVar26) {
                  pBVar21 = (BrotliDictionary *)(pBVar21->size_bits_by_length + 8);
                }
                else {
                  uVar11 = 0;
                  if ((uVar26 ^ uVar25) != 0) {
                    for (; ((uVar26 ^ uVar25) >> uVar11 & 1) == 0; uVar11 = uVar11 + 1) {
                    }
                  }
                  unaff_R12 = (BrotliDictionary *)
                              ((long)pBVar21 + ((uVar11 >> 3 & 0x1fffffff) - (long)pBVar28));
                }
                if (uVar25 != uVar26) goto LAB_0112c95f;
                puVar43 = puVar43 + 1;
                pBVar37 = (BrotliDictionary *)&pBVar37[-1].data;
              } while ((uint8_t **)0x7 < pBVar37);
            }
            pBVar34 = pBVar21;
            if (pBVar37 != (BrotliDictionary *)0x0) {
              pBVar34 = (BrotliDictionary *)
                        (pBVar21->size_bits_by_length + (long)pBVar37->size_bits_by_length);
              pBVar42 = (BrotliDictionary *)0x0;
              do {
                if (pBVar42->size_bits_by_length[(long)pBVar21->size_bits_by_length] !=
                    *(uint8_t *)((long)puVar43 + (long)pBVar42)) {
                  pBVar34 = (BrotliDictionary *)
                            (pBVar42->size_bits_by_length + (long)pBVar21->size_bits_by_length);
                  break;
                }
                pBVar42 = (BrotliDictionary *)(pBVar42->size_bits_by_length + 1);
              } while (pBVar37 != pBVar42);
            }
            unaff_R12 = (BrotliDictionary *)((long)pBVar34 - (long)pBVar28);
LAB_0112c95f:
            if (((unaff_R12 != (BrotliDictionary *)0x0) &&
                (pBVar20 < (BrotliDictionary *)
                           (unaff_R12->size_bits_by_length + pBVar8->cutoffTransformsCount))) &&
               (pBVar20 = (BrotliDictionary *)
                          (pBVar31->size_bits_by_length +
                          (long)(unaff_R14->size_bits_by_length +
                                ((ulong)((uint)(pBVar8->cutoffTransforms >>
                                               ((char)((long)pBVar20 - (long)unaff_R12) * '\x06' &
                                               0x3fU)) & 0x3f) +
                                 ((long)pBVar20 - (long)unaff_R12) * 4 <<
                                (pBVar20->size_bits_by_length[(long)pBVar45->size_bits_by_length] &
                                0x3f)) + lVar1)), pBVar20 <= pBVar9)) {
              iVar18 = 0x1f;
              if ((uint)pBVar20 != 0) {
                for (; (uint)pBVar20 >> iVar18 == 0; iVar18 = iVar18 + -1) {
                }
              }
              uVar25 = ((long)unaff_R12 * 0x87 - (ulong)(uint)(iVar18 * 0x1e)) + 0x780;
              if (0x7e3 < uVar25) {
                local_154 = (uint)bVar24 - (int)unaff_R12;
                bVar47 = false;
                pBVar44 = unaff_R12;
                local_130 = pBVar20;
                local_128 = uVar25;
              }
            }
          }
          if (!bVar47) {
            pHVar10->dict_num_matches = pHVar10->dict_num_matches + 1;
          }
        }
      }
      puVar7[lVar48] = (uint)pBVar23;
      if (local_128 < 0x7e5) {
        local_160 = local_160 + 1;
        position = (size_t)(pBVar23->size_bits_by_length + 1);
        if (pBVar46 < position) {
          if ((BrotliDictionary *)(pBVar46->size_bits_by_length + (uint)((int)pBVar36 * 4)) <
              position) {
            pBVar20 = (BrotliDictionary *)(pBVar23->size_bits_by_length + 0x11);
            if (pBVar2 <= (BrotliDictionary *)(pBVar23->size_bits_by_length + 0x11)) {
              pBVar20 = pBVar2;
            }
            for (; position < pBVar20;
                position = (size_t)(((BrotliDictionary *)position)->size_bits_by_length + 4)) {
              puVar7[(uint)((ulong)(*(long *)(ringbuffer + (position & ringbuffer_mask)) *
                                   0x7bd3579bd3000000) >> 0x2f) + ((uint)position & 0x18) & 0x1ffff]
                   = (uint)position;
              local_160 = local_160 + 4;
            }
          }
          else {
            pBVar20 = (BrotliDictionary *)(pBVar23->size_bits_by_length + 9);
            if (pBVar2 <= (BrotliDictionary *)(pBVar23->size_bits_by_length + 9)) {
              pBVar20 = pBVar2;
            }
            for (; position < pBVar20;
                position = (size_t)(((BrotliDictionary *)position)->size_bits_by_length + 2)) {
              puVar7[(uint)((ulong)(*(long *)(ringbuffer + (position & ringbuffer_mask)) *
                                   0x7bd3579bd3000000) >> 0x2f) + ((uint)position & 0x18) & 0x1ffff]
                   = (uint)position;
              local_160 = local_160 + 2;
            }
          }
        }
      }
      else {
        iVar18 = *dist_cache;
        unaff_R12 = pBVar44;
        iVar14 = 0;
        do {
          local_150 = (BrotliDictionary *)((long)&local_150[-1].data + 7);
          pBVar46 = (BrotliDictionary *)((long)&unaff_R12[-1].data + 7);
          if (local_150 <= pBVar46) {
            pBVar46 = local_150;
          }
          if (4 < params->quality) {
            pBVar46 = (BrotliDictionary *)0x0;
          }
          pBVar20 = (BrotliDictionary *)(pBVar23->size_bits_by_length + 1);
          pBVar31 = pBVar30;
          if (pBVar20 < pBVar30) {
            pBVar31 = pBVar20;
          }
          pBVar28 = (BrotliDictionary *)(pBVar23->size_bits_by_length + sVar5 + 1);
          if (pBVar30 <= (BrotliDictionary *)(pBVar23->size_bits_by_length + sVar5 + 1)) {
            pBVar28 = pBVar30;
          }
          if ((params->dictionary).contextual.context_based != 0) {
            local_f4 = (uint)(params->dictionary).contextual.context_map
                             [literal_context_lut[local_98 + 0x100] |
                              literal_context_lut[ringbuffer[(ulong)pBVar23 & ringbuffer_mask]]];
            local_98 = (ulong)ringbuffer[(ulong)pBVar23 & ringbuffer_mask];
          }
          pBVar45 = (BrotliDictionary *)(ringbuffer + ((ulong)pBVar20 & ringbuffer_mask));
          uVar38 = pBVar45->size_bits_by_length[(long)pBVar46->size_bits_by_length];
          pBVar21 = (BrotliDictionary *)((long)pBVar20 - (long)iVar18);
          local_170 = 0x7e4;
          if ((pBVar21 < pBVar20) &&
             (puVar33 = (ulong *)(ringbuffer + ((uint)pBVar21 & uVar15)), pBVar21 = local_150,
             pBVar44 = pBVar45, puVar43 = puVar33,
             uVar38 == pBVar46->size_bits_by_length[(long)puVar33])) {
            for (; (BrotliDictionary *)0x7 < pBVar21;
                pBVar21 = (BrotliDictionary *)&pBVar21[-1].data) {
              uVar25 = *(ulong *)pBVar44->size_bits_by_length;
              uVar26 = *puVar43;
              if (uVar25 == uVar26) {
                puVar43 = puVar43 + 1;
              }
              else {
                uVar11 = 0;
                if ((uVar26 ^ uVar25) != 0) {
                  for (; ((uVar26 ^ uVar25) >> uVar11 & 1) == 0; uVar11 = uVar11 + 1) {
                  }
                }
                unaff_R14 = (BrotliDictionary *)
                            ((long)puVar43 + ((uVar11 >> 3 & 0x1fffffff) - (long)puVar33));
              }
              if (uVar25 != uVar26) goto LAB_0112c04e;
              pBVar44 = (BrotliDictionary *)(pBVar44->size_bits_by_length + 8);
            }
            puVar40 = puVar43;
            if (pBVar21 != (BrotliDictionary *)0x0) {
              puVar40 = (ulong *)((long)puVar43 + (long)pBVar21);
              pBVar37 = (BrotliDictionary *)0x0;
              do {
                if (*(uint8_t *)((long)puVar43 + (long)pBVar37) !=
                    pBVar37->size_bits_by_length[(long)pBVar44->size_bits_by_length]) {
                  puVar40 = (ulong *)((long)puVar43 + (long)pBVar37);
                  break;
                }
                pBVar37 = (BrotliDictionary *)(pBVar37->size_bits_by_length + 1);
              } while (pBVar21 != pBVar37);
            }
            unaff_R14 = (BrotliDictionary *)((long)puVar40 - (long)puVar33);
LAB_0112c04e:
            if ((unaff_R14 < (BrotliDictionary *)0x4) ||
               (uVar25 = (long)unaff_R14 * 0x87 + 0x78f, uVar25 < 0x7e5)) goto LAB_0112c08b;
            uVar38 = unaff_R14->size_bits_by_length[(long)pBVar45->size_bits_by_length];
            pBVar46 = unaff_R14;
            local_170 = uVar25;
            local_120 = (BrotliDictionary *)(long)iVar18;
          }
          else {
LAB_0112c08b:
            local_120 = (BrotliDictionary *)0x0;
          }
          pBVar8 = (params->dictionary).contextual.dict[local_f4];
          uVar32 = (uint)((ulong)(*(long *)(ringbuffer + ((ulong)pBVar20 & ringbuffer_mask)) *
                                 0x7bd3579bd3000000) >> 0x2f);
          lVar27 = 0;
          lVar48 = 0;
          lVar49 = 1;
          do {
            auStack_58[lVar27] = lVar48 * 8 + (ulong)uVar32 & 0x1ffff;
            auStack_58[lVar27 + 1] = lVar49 * 8 + (ulong)uVar32 & 0x1ffff;
            lVar27 = lVar27 + 2;
            lVar48 = lVar48 + 2;
            lVar49 = lVar49 + 2;
          } while (lVar27 != 4);
          lVar48 = *(long *)((long)auStack_58 + (ulong)((uint)pBVar20 & 0x18));
          lVar49 = 0;
          do {
            uVar32 = puVar7[auStack_58[lVar49]];
            puVar43 = (ulong *)(ringbuffer + (uVar15 & uVar32));
            if (((uVar38 == pBVar46->size_bits_by_length[(long)puVar43]) &&
                (pBVar20 != (BrotliDictionary *)(ulong)uVar32)) &&
               (pBVar37 = (BrotliDictionary *)((long)pBVar20 - (long)(ulong)uVar32),
               pBVar21 = local_150, pBVar44 = pBVar45, puVar33 = puVar43, pBVar37 <= pBVar31)) {
              for (; (BrotliDictionary *)0x7 < pBVar21;
                  pBVar21 = (BrotliDictionary *)&pBVar21[-1].data) {
                uVar25 = *(ulong *)pBVar44->size_bits_by_length;
                uVar26 = *puVar33;
                if (uVar25 == uVar26) {
                  puVar33 = puVar33 + 1;
                }
                else {
                  uVar11 = 0;
                  if ((uVar26 ^ uVar25) != 0) {
                    for (; ((uVar26 ^ uVar25) >> uVar11 & 1) == 0; uVar11 = uVar11 + 1) {
                    }
                  }
                  unaff_R14 = (BrotliDictionary *)
                              ((long)puVar33 + ((uVar11 >> 3 & 0x1fffffff) - (long)puVar43));
                }
                if (uVar25 != uVar26) goto LAB_0112c1ca;
                pBVar44 = (BrotliDictionary *)(pBVar44->size_bits_by_length + 8);
              }
              puVar40 = puVar33;
              if (pBVar21 != (BrotliDictionary *)0x0) {
                puVar40 = (ulong *)((long)puVar33 + (long)pBVar21);
                pBVar34 = (BrotliDictionary *)0x0;
                do {
                  if (*(uint8_t *)((long)puVar33 + (long)pBVar34) !=
                      pBVar34->size_bits_by_length[(long)pBVar44->size_bits_by_length]) {
                    puVar40 = (ulong *)((long)puVar33 + (long)pBVar34);
                    break;
                  }
                  pBVar34 = (BrotliDictionary *)(pBVar34->size_bits_by_length + 1);
                } while (pBVar21 != pBVar34);
              }
              unaff_R14 = (BrotliDictionary *)((long)puVar40 - (long)puVar43);
LAB_0112c1ca:
              if ((BrotliDictionary *)0x3 < unaff_R14) {
                iVar35 = 0x1f;
                if ((uint)pBVar37 != 0) {
                  for (; (uint)pBVar37 >> iVar35 == 0; iVar35 = iVar35 + -1) {
                  }
                }
                uVar25 = (ulong)(iVar35 * -0x1e + 0x780) + (long)unaff_R14 * 0x87;
                if (local_170 < uVar25) {
                  uVar38 = unaff_R14->size_bits_by_length[(long)pBVar45->size_bits_by_length];
                  pBVar46 = unaff_R14;
                  local_170 = uVar25;
                  local_120 = pBVar37;
                }
              }
            }
            lVar49 = lVar49 + 1;
          } while (lVar49 != 4);
          iVar35 = 0;
          if ((local_170 == 0x7e4) &&
             (pHVar10 = (hasher->privat)._H2.common,
             pHVar10->dict_num_lookups >> 7 <= pHVar10->dict_num_matches)) {
            iVar41 = *(int *)pBVar45->size_bits_by_length;
            puVar22 = pBVar8->hash_table_lengths;
            pHVar10->dict_num_lookups = pHVar10->dict_num_lookups + 1;
            uVar25 = (ulong)((uint)(iVar41 * 0x1e35a7bd) >> 0x12);
            bVar24 = puVar22[uVar25 * 2];
            pBVar31 = (BrotliDictionary *)(ulong)bVar24;
            if (pBVar31 != (BrotliDictionary *)0x0) {
              unaff_R14 = (BrotliDictionary *)CONCAT71((int7)((ulong)unaff_R14 >> 8),1);
              iVar41 = 0;
              iVar35 = 0;
              if (pBVar31 <= local_150) {
                pBVar21 = pBVar8->words;
                puVar43 = (ulong *)(pBVar21->data +
                                   (ulong)pBVar21->offsets_by_length[(long)pBVar31] +
                                   (ulong)pBVar8->hash_table_words[uVar25 * 2] * (long)pBVar31);
                pBVar44 = pBVar21;
                pBVar37 = pBVar31;
                pBVar34 = pBVar45;
                if (7 < bVar24) {
                  do {
                    uVar26 = *puVar43;
                    uVar11 = *(ulong *)pBVar34->size_bits_by_length;
                    if (uVar26 == uVar11) {
                      pBVar34 = (BrotliDictionary *)(pBVar34->size_bits_by_length + 8);
                    }
                    else {
                      uVar13 = 0;
                      if ((uVar11 ^ uVar26) != 0) {
                        for (; ((uVar11 ^ uVar26) >> uVar13 & 1) == 0; uVar13 = uVar13 + 1) {
                        }
                      }
                      pBVar44 = (BrotliDictionary *)
                                ((long)pBVar34 + ((uVar13 >> 3 & 0x1fffffff) - (long)pBVar45));
                    }
                    if (uVar26 != uVar11) goto LAB_0112c3b8;
                    puVar43 = puVar43 + 1;
                    pBVar37 = (BrotliDictionary *)&pBVar37[-1].data;
                  } while ((uint8_t **)0x7 < pBVar37);
                }
                if (pBVar37 != (BrotliDictionary *)0x0) {
                  pBVar44 = (BrotliDictionary *)0x0;
                  do {
                    pBVar42 = pBVar44;
                    if (pBVar44->size_bits_by_length[(long)pBVar34->size_bits_by_length] !=
                        *(uint8_t *)((long)puVar43 + (long)pBVar44)) break;
                    pBVar44 = (BrotliDictionary *)(pBVar44->size_bits_by_length + 1);
                    pBVar42 = pBVar37;
                  } while (pBVar37 != pBVar44);
                  pBVar34 = (BrotliDictionary *)
                            (pBVar42->size_bits_by_length + (long)pBVar34->size_bits_by_length);
                }
                pBVar44 = (BrotliDictionary *)((long)pBVar34 - (long)pBVar45);
                pBVar34 = pBVar44;
LAB_0112c3b8:
                unaff_R14 = (BrotliDictionary *)CONCAT71((int7)((ulong)pBVar34 >> 8),1);
                iVar35 = iVar41;
                if (((pBVar44 != (BrotliDictionary *)0x0) &&
                    (pBVar31 < (BrotliDictionary *)
                               (pBVar44->size_bits_by_length + pBVar8->cutoffTransformsCount))) &&
                   (pBVar31 = (BrotliDictionary *)
                              (pBVar28->size_bits_by_length +
                              ((ulong)((uint)(pBVar8->cutoffTransforms >>
                                             ((char)((long)pBVar31 - (long)pBVar44) * '\x06' & 0x3fU
                                             )) & 0x3f) + ((long)pBVar31 - (long)pBVar44) * 4 <<
                              (pBVar31->size_bits_by_length[(long)pBVar21->size_bits_by_length] &
                              0x3f)) + (ulong)pBVar8->hash_table_words[uVar25 * 2] + lVar1),
                   pBVar31 <= pBVar9)) {
                  iVar41 = 0x1f;
                  if ((uint)pBVar31 != 0) {
                    for (; (uint)pBVar31 >> iVar41 == 0; iVar41 = iVar41 + -1) {
                    }
                  }
                  uVar25 = ((long)pBVar44 * 0x87 - (ulong)(uint)(iVar41 * 0x1e)) + 0x780;
                  if (0x7e3 < uVar25) {
                    iVar35 = (uint)bVar24 - (int)pBVar44;
                    unaff_R14 = (BrotliDictionary *)0x0;
                    pBVar46 = pBVar44;
                    local_170 = uVar25;
                    local_120 = pBVar31;
                  }
                }
              }
              if ((char)unaff_R14 == '\0') {
                pHVar10->dict_num_matches = pHVar10->dict_num_matches + 1;
              }
            }
          }
          puVar7[lVar48] = (uint)pBVar20;
          bVar47 = local_128 + 0xaf <= local_170;
          pBVar31 = pBVar23;
          iVar41 = iVar14;
          if (bVar47) {
            local_160 = local_160 + 1;
            local_128 = local_170;
            local_130 = local_120;
            pBVar31 = pBVar20;
            unaff_R12 = pBVar46;
            local_154 = iVar35;
            iVar41 = iVar14 + 1;
          }
          bVar12 = iVar14 < 3;
          puVar22 = pBVar23->size_bits_by_length;
          pBVar23 = pBVar31;
          iVar14 = iVar41;
        } while (bVar47 && (bVar12 && puVar22 + 9 < puVar4));
        pBVar46 = (BrotliDictionary *)(pBVar31->size_bits_by_length + sVar5);
        if (pBVar30 <= (BrotliDictionary *)(pBVar31->size_bits_by_length + sVar5)) {
          pBVar46 = pBVar30;
        }
        if ((BrotliDictionary *)(pBVar46->size_bits_by_length + sVar6) < local_130) {
LAB_0112c68d:
          puVar22 = local_130->size_bits_by_length + 0xf;
        }
        else {
          uVar32 = 0;
          bVar47 = false;
          if (local_130 != (BrotliDictionary *)(long)*dist_cache) {
            if (local_130 == (BrotliDictionary *)(long)dist_cache[1]) {
              uVar32 = 1;
            }
            else {
              puVar22 = (uint8_t *)((long)local_130 + (3 - (long)*dist_cache));
              if (puVar22 < (uint8_t *)0x7) {
                bVar24 = (byte)((int)puVar22 << 2);
                uVar32 = 0x9750468;
              }
              else {
                puVar22 = (uint8_t *)((long)local_130 + (3 - (long)dist_cache[1]));
                if ((uint8_t *)0x6 < puVar22) {
                  if (local_130 != (BrotliDictionary *)(long)dist_cache[2]) {
                    bVar47 = local_130 != (BrotliDictionary *)(long)dist_cache[3];
                    uVar32 = 3;
                    goto LAB_0112c689;
                  }
                  uVar32 = 2;
                  goto LAB_0112c687;
                }
                bVar24 = (byte)((int)puVar22 << 2);
                uVar32 = 0xfdb1ace;
              }
              uVar32 = uVar32 >> (bVar24 & 0x1f) & 0xf;
            }
LAB_0112c687:
            bVar47 = false;
          }
LAB_0112c689:
          if (bVar47) goto LAB_0112c68d;
          puVar22 = (uint8_t *)(ulong)uVar32;
        }
        if ((local_130 <= (BrotliDictionary *)(pBVar46->size_bits_by_length + sVar6)) &&
           (puVar22 != (uint8_t *)0x0)) {
          dist_cache[3] = dist_cache[2];
          *(undefined8 *)(dist_cache + 1) = *(undefined8 *)dist_cache;
          *dist_cache = (int)local_130;
        }
        local_108->insert_len_ = (uint32_t)local_160;
        local_108->copy_len_ = local_154 << 0x19 | (uint)unaff_R12;
        uVar25 = (ulong)(params->dist).num_direct_distance_codes;
        puVar3 = (uint8_t *)(uVar25 + 0x10);
        if (puVar22 < puVar3) {
          local_108->dist_prefix_ = (uint16_t)puVar22;
          uVar17 = 0;
        }
        else {
          uVar17 = (params->dist).distance_postfix_bits;
          bVar24 = (byte)uVar17;
          puVar22 = puVar22 + ((4L << (bVar24 & 0x3f)) - uVar25) + -0x10;
          uVar32 = 0x1f;
          if ((uint)puVar22 != 0) {
            for (; (uint)puVar22 >> uVar32 == 0; uVar32 = uVar32 - 1) {
            }
          }
          uVar32 = (uVar32 ^ 0xffffffe0) + 0x1f;
          bVar47 = ((ulong)puVar22 >> ((ulong)uVar32 & 0x3f) & 1) != 0;
          iVar18 = uVar32 - uVar17;
          local_108->dist_prefix_ =
               (short)((uint)bVar47 + iVar18 * 2 + 0xfffe << (bVar24 & 0x3f)) +
               (short)puVar3 + (~(ushort)(-1 << (bVar24 & 0x1f)) & (ushort)puVar22) |
               (short)iVar18 * 0x400;
          uVar17 = (uint32_t)
                   ((long)puVar22 - ((ulong)bVar47 + 2 << ((byte)uVar32 & 0x3f)) >> (bVar24 & 0x3f))
          ;
        }
        local_108->dist_extra_ = uVar17;
        uVar25 = local_160;
        if (5 < local_160) {
          if (local_160 < 0x82) {
            uVar32 = 0x1f;
            uVar39 = (uint)(local_160 - 2);
            if (uVar39 != 0) {
              for (; uVar39 >> uVar32 == 0; uVar32 = uVar32 - 1) {
              }
            }
            uVar25 = (ulong)((int)(local_160 - 2 >> ((char)(uVar32 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
                             (uVar32 ^ 0xffffffe0) * 2 + 0x40);
          }
          else if (local_160 < 0x842) {
            uVar39 = (uint32_t)local_160 - 0x42;
            uVar32 = 0x1f;
            if (uVar39 != 0) {
              for (; uVar39 >> uVar32 == 0; uVar32 = uVar32 - 1) {
              }
            }
            uVar25 = (ulong)((uVar32 ^ 0xffe0) + 0x2a);
          }
          else {
            uVar25 = 0x15;
            if (0x1841 < local_160) {
              uVar25 = (ulong)(ushort)(0x17 - (local_160 < 0x5842));
            }
          }
        }
        uVar32 = local_154 + (uint)unaff_R12;
        if (uVar32 < 10) {
          uVar39 = uVar32 - 2;
        }
        else if (uVar32 < 0x86) {
          uVar32 = uVar32 - 6;
          uVar39 = 0x1f;
          if (uVar32 != 0) {
            for (; uVar32 >> uVar39 == 0; uVar39 = uVar39 - 1) {
            }
          }
          uVar39 = (int)((ulong)(long)(int)uVar32 >> ((char)(uVar39 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
                   (uVar39 ^ 0xffffffe0) * 2 + 0x42;
        }
        else {
          uVar39 = 0x17;
          if (uVar32 < 0x846) {
            uVar39 = 0x1f;
            if (uVar32 - 0x46 != 0) {
              for (; uVar32 - 0x46 >> uVar39 == 0; uVar39 = uVar39 - 1) {
              }
            }
            uVar39 = (uVar39 ^ 0xffe0) + 0x2c;
          }
        }
        uVar16 = (ushort)uVar39;
        uVar29 = (uVar16 & 7) + ((ushort)uVar25 & 7) * 8;
        if ((((local_108->dist_prefix_ & 0x3ff) == 0) && ((ushort)uVar25 < 8)) && (uVar16 < 0x10)) {
          if (7 < uVar16) {
            uVar29 = uVar29 + 0x40;
          }
        }
        else {
          iVar18 = (int)((uVar25 & 0xffff) >> 3) * 3 + ((uVar39 & 0xffff) >> 3);
          uVar29 = uVar29 + ((ushort)(0x520d40 >> ((char)iVar18 * '\x02' & 0x1fU)) & 0xc0) +
                            (short)iVar18 * 0x40 + 0x40;
        }
        local_108->cmd_prefix_ = uVar29;
        *num_literals = *num_literals + local_160;
        position = (size_t)(pBVar31->size_bits_by_length + (long)unaff_R12->size_bits_by_length);
        pBVar23 = pBVar19;
        if (position < pBVar19) {
          pBVar23 = (BrotliDictionary *)position;
        }
        pBVar20 = (BrotliDictionary *)(pBVar31->size_bits_by_length + 2);
        if (local_130 < (BrotliDictionary *)((ulong)unaff_R12 >> 2)) {
          pBVar46 = (BrotliDictionary *)(position + (long)local_130 * -4);
          if (pBVar46 < pBVar20) {
            pBVar46 = pBVar20;
          }
          pBVar20 = pBVar46;
          if (pBVar23 < pBVar46) {
            pBVar20 = pBVar23;
          }
        }
        pBVar46 = (BrotliDictionary *)
                  (pBVar31->size_bits_by_length +
                  (long)(pBVar36->size_bits_by_length + (long)unaff_R12 * 2));
        local_108 = local_108 + 1;
        if (pBVar20 < pBVar23) {
          do {
            puVar7[(uint)((ulong)(*(long *)(ringbuffer + ((ulong)pBVar20 & ringbuffer_mask)) *
                                 0x7bd3579bd3000000) >> 0x2f) + ((uint)pBVar20 & 0x18) & 0x1ffff] =
                 (uint)pBVar20;
            pBVar20 = (BrotliDictionary *)(pBVar20->size_bits_by_length + 1);
          } while (pBVar23 != pBVar20);
        }
        local_160 = 0;
        unaff_R14 = pBVar36;
      }
      pBVar23 = (BrotliDictionary *)position;
    } while (((BrotliDictionary *)position)->size_bits_by_length + 8 < puVar4);
  }
  else {
    local_108 = commands;
  }
  *last_insert_len = (size_t)(puVar4 + (local_160 - position));
  *num_commands = *num_commands + ((long)local_108 - (long)commands >> 4);
  return;
}

Assistant:

static BROTLI_NOINLINE void EXPORT_FN(CreateBackwardReferences)(
    size_t num_bytes, size_t position,
    const uint8_t* ringbuffer, size_t ringbuffer_mask,
    ContextLut literal_context_lut, const BrotliEncoderParams* params,
    Hasher* hasher, int* dist_cache, size_t* last_insert_len,
    Command* commands, size_t* num_commands, size_t* num_literals) {
  HASHER()* privat = &hasher->privat.FN(_);
  /* Set maximum distance, see section 9.1. of the spec. */
  const size_t max_backward_limit = BROTLI_MAX_BACKWARD_LIMIT(params->lgwin);
  const size_t position_offset = params->stream_offset;

  const Command* const orig_commands = commands;
  size_t insert_length = *last_insert_len;
  const size_t pos_end = position + num_bytes;
  const size_t store_end = num_bytes >= FN(StoreLookahead)() ?
      position + num_bytes - FN(StoreLookahead)() + 1 : position;

  /* For speed up heuristics for random data. */
  const size_t random_heuristics_window_size =
      LiteralSpreeLengthForSparseSearch(params);
  size_t apply_random_heuristics = position + random_heuristics_window_size;
  const size_t gap = params->dictionary.compound.total_size;

  /* Minimum score to accept a backward reference. */
  const score_t kMinScore = BROTLI_SCORE_BASE + 100;

  FN(PrepareDistanceCache)(privat, dist_cache);

  while (position + FN(HashTypeLength)() < pos_end) {
    size_t max_length = pos_end - position;
    size_t max_distance = BROTLI_MIN(size_t, position, max_backward_limit);
    size_t dictionary_start = BROTLI_MIN(size_t,
        position + position_offset, max_backward_limit);
    HasherSearchResult sr;
    int dict_id = 0;
    uint8_t p1 = 0;
    uint8_t p2 = 0;
    if (params->dictionary.contextual.context_based) {
      p1 = position >= 1 ?
          ringbuffer[(size_t)(position - 1) & ringbuffer_mask] : 0;
      p2 = position >= 2 ?
          ringbuffer[(size_t)(position - 2) & ringbuffer_mask] : 0;
      dict_id = params->dictionary.contextual.context_map[
          BROTLI_CONTEXT(p1, p2, literal_context_lut)];
    }
    sr.len = 0;
    sr.len_code_delta = 0;
    sr.distance = 0;
    sr.score = kMinScore;
    FN(FindLongestMatch)(privat, params->dictionary.contextual.dict[dict_id],
        ringbuffer, ringbuffer_mask, dist_cache, position, max_length,
        max_distance, dictionary_start + gap, params->dist.max_distance, &sr);
    if (ENABLE_COMPOUND_DICTIONARY) {
      LookupCompoundDictionaryMatch(&params->dictionary.compound, ringbuffer,
          ringbuffer_mask, dist_cache, position, max_length,
          dictionary_start, params->dist.max_distance, &sr);
    }
    if (sr.score > kMinScore) {
      /* Found a match. Let's look for something even better ahead. */
      int delayed_backward_references_in_row = 0;
      --max_length;
      for (;; --max_length) {
        const score_t cost_diff_lazy = 175;
        HasherSearchResult sr2;
        sr2.len = params->quality < MIN_QUALITY_FOR_EXTENSIVE_REFERENCE_SEARCH ?
            BROTLI_MIN(size_t, sr.len - 1, max_length) : 0;
        sr2.len_code_delta = 0;
        sr2.distance = 0;
        sr2.score = kMinScore;
        max_distance = BROTLI_MIN(size_t, position + 1, max_backward_limit);
        dictionary_start = BROTLI_MIN(size_t,
            position + 1 + position_offset, max_backward_limit);
        if (params->dictionary.contextual.context_based) {
          p2 = p1;
          p1 = ringbuffer[position & ringbuffer_mask];
          dict_id = params->dictionary.contextual.context_map[
              BROTLI_CONTEXT(p1, p2, literal_context_lut)];
        }
        FN(FindLongestMatch)(privat,
            params->dictionary.contextual.dict[dict_id],
            ringbuffer, ringbuffer_mask, dist_cache, position + 1, max_length,
            max_distance, dictionary_start + gap, params->dist.max_distance,
            &sr2);
        if (ENABLE_COMPOUND_DICTIONARY) {
          LookupCompoundDictionaryMatch(
              &params->dictionary.compound, ringbuffer,
              ringbuffer_mask, dist_cache, position + 1, max_length,
              dictionary_start, params->dist.max_distance, &sr2);
        }
        if (sr2.score >= sr.score + cost_diff_lazy) {
          /* Ok, let's just write one byte for now and start a match from the
             next byte. */
          ++position;
          ++insert_length;
          sr = sr2;
          if (++delayed_backward_references_in_row < 4 &&
              position + FN(HashTypeLength)() < pos_end) {
            continue;
          }
        }
        break;
      }
      apply_random_heuristics =
          position + 2 * sr.len + random_heuristics_window_size;
      dictionary_start = BROTLI_MIN(size_t,
          position + position_offset, max_backward_limit);
      {
        /* The first 16 codes are special short-codes,
           and the minimum offset is 1. */
        size_t distance_code = ComputeDistanceCode(
            sr.distance, dictionary_start + gap, dist_cache);
        if ((sr.distance <= (dictionary_start + gap)) && distance_code > 0) {
          dist_cache[3] = dist_cache[2];
          dist_cache[2] = dist_cache[1];
          dist_cache[1] = dist_cache[0];
          dist_cache[0] = (int)sr.distance;
          FN(PrepareDistanceCache)(privat, dist_cache);
        }
        InitCommand(commands++, &params->dist, insert_length,
            sr.len, sr.len_code_delta, distance_code);
      }
      *num_literals += insert_length;
      insert_length = 0;
      /* Put the hash keys into the table, if there are enough bytes left.
         Depending on the hasher implementation, it can push all positions
         in the given range or only a subset of them.
         Avoid hash poisoning with RLE data. */
      {
        size_t range_start = position + 2;
        size_t range_end = BROTLI_MIN(size_t, position + sr.len, store_end);
        if (sr.distance < (sr.len >> 2)) {
          range_start = BROTLI_MIN(size_t, range_end, BROTLI_MAX(size_t,
              range_start, position + sr.len - (sr.distance << 2)));
        }
        FN(StoreRange)(privat, ringbuffer, ringbuffer_mask, range_start,
                       range_end);
      }
      position += sr.len;
    } else {
      ++insert_length;
      ++position;
      /* If we have not seen matches for a long time, we can skip some
         match lookups. Unsuccessful match lookups are very very expensive
         and this kind of a heuristic speeds up compression quite
         a lot. */
      if (position > apply_random_heuristics) {
        /* Going through uncompressible data, jump. */
        if (position >
            apply_random_heuristics + 4 * random_heuristics_window_size) {
          /* It is quite a long time since we saw a copy, so we assume
             that this data is not compressible, and store hashes less
             often. Hashes of non compressible data are less likely to
             turn out to be useful in the future, too, so we store less of
             them to not to flood out the hash table of good compressible
             data. */
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 4);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 16, pos_end - kMargin);
          for (; position < pos_jump; position += 4) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 4;
          }
        } else {
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 2);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 8, pos_end - kMargin);
          for (; position < pos_jump; position += 2) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 2;
          }
        }
      }
    }
  }
  insert_length += pos_end - position;
  *last_insert_len = insert_length;
  *num_commands += (size_t)(commands - orig_commands);
}